

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_generator_testing.h
# Opt level: O0

NonStandardLayout * __thiscall
phmap::priv::hash_internal::Generator<phmap::priv::NonStandardLayout,_void>::operator()
          (NonStandardLayout *__return_storage_ptr__,
          Generator<phmap::priv::NonStandardLayout,_void> *this)

{
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_39;
  string local_38;
  Generator<phmap::priv::NonStandardLayout,_void> *local_18;
  Generator<phmap::priv::NonStandardLayout,_void> *this_local;
  
  local_18 = this;
  this_local = (Generator<phmap::priv::NonStandardLayout,_void> *)__return_storage_ptr__;
  Generator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
  operator()(&local_38,&local_39);
  NonStandardLayout::NonStandardLayout(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

NonStandardLayout operator()() const {
        return NonStandardLayout(Generator<std::string>()());
    }